

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

bool __thiscall
Clasp::DefaultUnfoundedCheck::isExternal(DefaultUnfoundedCheck *this,BodyPtr *n,weight_t *S)

{
  pointer pAVar1;
  Solver *pSVar2;
  GraphPtr pDVar3;
  int iVar4;
  uint *puVar5;
  uint uVar6;
  
  puVar5 = (n->node->super_Node).sep_;
  iVar4 = *S;
  uVar6 = *puVar5;
  if (((n->node->super_Node).field_0x7 & 0x20) == 0) {
    if (-1 < iVar4 && uVar6 != 0xffffffff) {
      pAVar1 = (this->atoms_).ebo_.buf;
      pSVar2 = this->solver_;
      pDVar3 = this->graph_;
      do {
        puVar5 = puVar5 + 1;
        if (((pAVar1[uVar6].field_0x3 & 0x40) != 0) &&
           (uVar6 = (pDVar3->atoms_).ebo_.buf[uVar6].super_Node.lit.rep_,
           (byte)(*(byte *)((long)(pSVar2->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc))
                 & 3) != (byte)(((uVar6 & 2) == 0) + 1U))) {
          iVar4 = iVar4 + -1;
          *S = iVar4;
        }
        uVar6 = *puVar5;
      } while ((uVar6 != 0xffffffff) && (-1 < iVar4));
    }
  }
  else if (-1 < iVar4 && uVar6 != 0xffffffff) {
    pAVar1 = (this->atoms_).ebo_.buf;
    pSVar2 = this->solver_;
    pDVar3 = this->graph_;
    do {
      if (((pAVar1[uVar6].field_0x3 & 0x40) != 0) &&
         (uVar6 = (pDVar3->atoms_).ebo_.buf[uVar6].super_Node.lit.rep_,
         (byte)(*(byte *)((long)(pSVar2->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc)) &
               3) != (byte)(((uVar6 & 2) == 0) + 1U))) {
        iVar4 = iVar4 - puVar5[1];
        *S = iVar4;
      }
      uVar6 = puVar5[2];
    } while ((uVar6 != 0xffffffff) && (puVar5 = puVar5 + 2, -1 < iVar4));
  }
  return -1 < iVar4;
}

Assistant:

bool DefaultUnfoundedCheck::isExternal(const BodyPtr& n, weight_t& S) const {
#define IN_UFS(id) ( (atoms_[(id)].ufs) && !solver_->isFalse(graph_->getAtom((id)).lit) )
	if (!n.node->sum()) {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; ++x) {
			if (IN_UFS(*x)) { S -= 1; }
		}
	}
	else {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; x+=2) {
			if (IN_UFS(*x)) { S -= static_cast<weight_t>(x[1]); }
		}
	}
	return S >= 0;
#undef IN_UFS
}